

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall IteratorTest::indexTest<false>(IteratorTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  char *pcVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  undefined8 extraout_RDX_04;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *__s;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar8;
  bool local_2ed;
  int local_2ec;
  undefined1 local_2e8 [4];
  int i_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_2b8;
  undefined1 local_288 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_2;
  undefined1 local_240 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_1f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  undefined1 local_1d8 [4];
  int i_1;
  undefined1 local_1a8 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  undefined1 local_160 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_118 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_c8 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  IteratorTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  __s = (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8,__s);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  uVar7 = extraout_RDX;
  for (shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x18;
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pcVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::index
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8,(char *)__s
                        ,(int)uVar7);
    shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         pcVar6 == (char *)(long)(this->data_
                                  [shape_1.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] / 2);
    test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
    uVar7 = extraout_RDX_00;
  }
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_118,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_118,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_118);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_118);
  paVar1 = (allocator<int> *)
           ((long)&it_1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_160,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_1d8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_160);
  pIVar8 = (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1d8;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,pIVar8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1d8);
  uVar7 = extraout_RDX_01;
  for (shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x18;
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pcVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,
                        (char *)pIVar8,(int)uVar7);
    shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ =
         pcVar6 == (char *)(long)(this->data_
                                  [shape_2.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] / 2);
    test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
    uVar7 = extraout_RDX_02;
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_160);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_118);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8);
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_240,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_288);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_2e8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_240);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_2b8,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_2e8);
  pIVar8 = &local_2b8;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_288,pIVar8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_2b8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_2e8);
  uVar7 = extraout_RDX_03;
  for (local_2ec = 0; local_2ec < 0x18; local_2ec = local_2ec + 1) {
    pcVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_288,
                        (char *)pIVar8,(int)uVar7);
    local_2ed = pcVar6 == (char *)(long)(this->data_[local_2ec] / 2);
    test(&local_2ed);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_288);
    uVar7 = extraout_RDX_04;
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_288);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_240);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8);
  return;
}

Assistant:

void IteratorTest::indexTest() {
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.index()== static_cast<std::size_t>(data_[i]/2));
            ++it;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.index()== static_cast<std::size_t>(data_[i]/2));
            ++it;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.index()== static_cast<std::size_t>(data_[i]/2));
            ++it;
        }
    }
}